

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_Precision_Test::TestBody(FormatterTest_Precision_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_24;
  format_error *e_21;
  bool gtest_caught_expected_21;
  string gtest_expected_message_21;
  AssertionResult gtest_ar_23;
  format_error *e_20;
  bool gtest_caught_expected_20;
  string gtest_expected_message_20;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  format_error *e_19;
  bool gtest_caught_expected_19;
  string gtest_expected_message_19;
  AssertionResult gtest_ar_19;
  format_error *e_18;
  bool gtest_caught_expected_18;
  string gtest_expected_message_18;
  AssertionResult gtest_ar_18;
  format_error *e_17;
  bool gtest_caught_expected_17;
  string gtest_expected_message_17;
  AssertionResult gtest_ar_17;
  format_error *e_16;
  bool gtest_caught_expected_16;
  string gtest_expected_message_16;
  AssertionResult gtest_ar_16;
  format_error *e_15;
  bool gtest_caught_expected_15;
  string gtest_expected_message_15;
  AssertionResult gtest_ar_15;
  format_error *e_14;
  bool gtest_caught_expected_14;
  string gtest_expected_message_14;
  AssertionResult gtest_ar_14;
  format_error *e_13;
  bool gtest_caught_expected_13;
  string gtest_expected_message_13;
  AssertionResult gtest_ar_13;
  format_error *e_12;
  bool gtest_caught_expected_12;
  string gtest_expected_message_12;
  AssertionResult gtest_ar_12;
  format_error *e_11;
  bool gtest_caught_expected_11;
  string gtest_expected_message_11;
  AssertionResult gtest_ar_11;
  format_error *e_10;
  bool gtest_caught_expected_10;
  string gtest_expected_message_10;
  AssertionResult gtest_ar_10;
  format_error *e_9;
  bool gtest_caught_expected_9;
  string gtest_expected_message_9;
  AssertionResult gtest_ar_9;
  format_error *e_8;
  bool gtest_caught_expected_8;
  string gtest_expected_message_8;
  AssertionResult gtest_ar_8;
  format_error *e_7;
  bool gtest_caught_expected_7;
  string gtest_expected_message_7;
  AssertionResult gtest_ar_7;
  format_error *e_6;
  bool gtest_caught_expected_6;
  string gtest_expected_message_6;
  AssertionResult gtest_ar_6;
  format_error *e_5;
  bool gtest_caught_expected_5;
  string gtest_expected_message_5;
  AssertionResult gtest_ar_5;
  format_error *e_4;
  bool gtest_caught_expected_4;
  string gtest_expected_message_4;
  AssertionResult gtest_ar_4;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_3;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_2;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  size_t size;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  char format_str [256];
  undefined7 in_stack_ffffffffffffebe0;
  undefined1 in_stack_ffffffffffffebe7;
  char (*in_stack_ffffffffffffebe8) [4];
  string *expected;
  char *in_stack_ffffffffffffebf0;
  undefined4 in_stack_ffffffffffffebf8;
  int in_stack_ffffffffffffebfc;
  char *in_stack_ffffffffffffec00;
  undefined4 in_stack_ffffffffffffec08;
  Type in_stack_ffffffffffffec0c;
  AssertionResult *in_stack_ffffffffffffec10;
  char (*in_stack_ffffffffffffec18) [256];
  Message *in_stack_ffffffffffffec58;
  AssertHelper *in_stack_ffffffffffffec60;
  string local_ce8 [32];
  AssertionResult local_cc8 [3];
  undefined8 local_c98;
  string local_c90 [38];
  byte local_c6a;
  allocator local_c69;
  string local_c68 [32];
  AssertionResult local_c48 [3];
  undefined8 local_c18;
  string local_c10 [38];
  byte local_bea;
  allocator local_be9;
  string local_be8 [32];
  AssertionResult local_bc8 [2];
  unkbyte10 local_ba8;
  string local_b98 [32];
  AssertionResult local_b78 [2];
  undefined8 local_b58;
  string local_b50 [32];
  AssertionResult local_b30 [3];
  undefined1 local_af9;
  string local_af8 [38];
  byte local_ad2;
  allocator local_ad1;
  string local_ad0 [32];
  AssertionResult local_ab0 [3];
  undefined8 local_a80;
  string local_a78 [38];
  byte local_a52;
  allocator local_a51;
  string local_a50 [32];
  AssertionResult local_a30 [3];
  undefined8 local_a00;
  string local_9f8 [38];
  byte local_9d2;
  allocator local_9d1;
  string local_9d0 [32];
  AssertionResult local_9b0 [3];
  undefined8 local_980;
  string local_978 [38];
  byte local_952;
  allocator local_951;
  string local_950 [32];
  AssertionResult local_930 [3];
  undefined8 local_900;
  string local_8f8 [38];
  byte local_8d2;
  allocator local_8d1;
  string local_8d0 [32];
  AssertionResult local_8b0 [3];
  undefined8 local_880;
  string local_878 [38];
  byte local_852;
  allocator local_851;
  string local_850 [32];
  AssertionResult local_830 [3];
  undefined8 local_800;
  string local_7f8 [38];
  byte local_7d2;
  allocator local_7d1;
  string local_7d0 [32];
  AssertionResult local_7b0 [3];
  undefined8 local_780;
  string local_778 [38];
  byte local_752;
  allocator local_751;
  string local_750 [32];
  AssertionResult local_730 [3];
  undefined8 local_700;
  string local_6f8 [38];
  byte local_6d2;
  allocator local_6d1;
  string local_6d0 [32];
  AssertionResult local_6b0 [3];
  undefined4 local_67c;
  string local_678 [38];
  byte local_652;
  allocator local_651;
  string local_650 [32];
  AssertionResult local_630 [3];
  undefined4 local_5fc;
  string local_5f8 [38];
  byte local_5d2;
  allocator local_5d1;
  string local_5d0 [32];
  AssertionResult local_5b0 [3];
  undefined4 local_57c;
  string local_578 [38];
  byte local_552;
  allocator local_551;
  string local_550 [32];
  AssertionResult local_530 [3];
  undefined4 local_4fc;
  string local_4f8 [38];
  byte local_4d2;
  allocator local_4d1;
  string local_4d0 [32];
  AssertionResult local_4b0 [3];
  undefined4 local_47c;
  string local_478 [38];
  byte local_452;
  allocator local_451;
  string local_450 [32];
  AssertionResult local_430 [3];
  undefined4 local_3fc;
  string local_3f8 [38];
  byte local_3d2;
  allocator local_3d1;
  string local_3d0 [32];
  AssertionResult local_3b0 [3];
  undefined4 local_37c;
  string local_378 [38];
  byte local_352;
  allocator local_351;
  string local_350 [32];
  AssertionResult local_330 [3];
  undefined4 local_2fc;
  string local_2f8 [38];
  byte local_2d2;
  allocator local_2d1;
  string local_2d0 [32];
  AssertionResult local_2b0 [3];
  undefined4 local_27c;
  string local_278 [38];
  byte local_252;
  allocator local_251;
  string local_250 [32];
  AssertionResult local_230 [3];
  undefined4 local_1fc;
  string local_1f8 [38];
  byte local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  AssertionResult local_1b0;
  size_t local_1a0;
  int local_178;
  undefined4 local_174;
  string local_170 [38];
  byte local_14a;
  allocator local_149;
  string local_148 [48];
  AssertionResult local_118;
  char local_108 [264];
  
  safe_sprintf<256ul>((char (*) [256])local_108,"{0:.%u",0xffffffff);
  increment((char *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"number is too big",&local_149);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    local_14a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_174 = 0;
      fmt::v5::format<char[256],int>(in_stack_ffffffffffffec18,(int *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_170);
    }
    if ((local_14a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 2;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_148);
    if (local_178 != 0) goto LAB_001561fc;
  }
  else {
LAB_001561fc:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x156218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15627b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1562d3);
  local_1a0 = strlen(local_108);
  local_108[local_1a0] = '}';
  local_108[local_1a0 + 1] = '\0';
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"number is too big",&local_1d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    local_1d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1fc = 0;
      fmt::v5::format<char[256],int>(in_stack_ffffffffffffec18,(int *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_1f8);
    }
    if ((local_1d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 3;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_1d0);
    if (local_178 != 0) goto LAB_001566bc;
  }
  else {
LAB_001566bc:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x1566d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15673b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x156793);
  safe_sprintf<256ul>((char (*) [256])local_108,"{0:.%u",0x80000000);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"number is too big",&local_251);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    local_252 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_27c = 0;
      fmt::v5::format<char[256],int>(in_stack_ffffffffffffec18,(int *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_278);
    }
    if ((local_252 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 4;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_250);
    if (local_178 != 0) goto LAB_00156b55;
  }
  else {
LAB_00156b55:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x156b71);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x156bd4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x156c2c);
  safe_sprintf<256ul>((char (*) [256])local_108,"{0:.%u}",0x80000000);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"number is too big",&local_2d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    local_2d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_2fc = 0;
      fmt::v5::format<char[256],int>(in_stack_ffffffffffffec18,(int *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_2f8);
    }
    if ((local_2d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 5;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_2d0);
    if (local_178 != 0) goto LAB_00156fee;
  }
  else {
LAB_00156fee:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15700a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15706d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1570c5);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_330);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_350,"missing precision specifier",&local_351);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    local_352 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_37c = 0;
      fmt::v5::format<char[5],int>
                ((char (*) [5])in_stack_ffffffffffffec18,(int *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_378);
    }
    if ((local_352 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [99])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 6;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_350);
    if (local_178 != 0) goto LAB_0015746b;
  }
  else {
LAB_0015746b:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x157487);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x1574ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x157542);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,"missing precision specifier",&local_3d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    local_3d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_3fc = 0;
      fmt::v5::format<char[6],int>
                ((char (*) [6])in_stack_ffffffffffffec18,(int *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_3f8);
    }
    if ((local_3d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [100])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 7;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_3d0);
    if (local_178 != 0) goto LAB_001578e8;
  }
  else {
LAB_001578e8:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x157904);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x157967);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1579bf);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_430);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_450,"precision not allowed for this argument type",&local_451);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    local_452 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_47c = 0;
      fmt::v5::format<char[6],int>
                ((char (*) [6])in_stack_ffffffffffffec18,(int *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_478);
    }
    if ((local_452 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [100])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 8;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_450);
    if (local_178 != 0) goto LAB_00157d65;
  }
  else {
LAB_00157d65:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x157d81);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x157de4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x157e3c);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4d0,"precision not allowed for this argument type",&local_4d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    local_4d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_4fc = 0x2a;
      fmt::v5::format<char[7],int>
                ((char (*) [7])in_stack_ffffffffffffec18,(int *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_4f8);
    }
    if ((local_4d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [102])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 9;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_4d0);
    if (local_178 != 0) goto LAB_001581e2;
  }
  else {
LAB_001581e2:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x1581fe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x158261);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1582b9);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_530);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_550,"precision not allowed for this argument type",&local_551);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    local_552 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_57c = 0x2a;
      fmt::v5::format<char[8],int>
                ((char (*) [8])in_stack_ffffffffffffec18,(int *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_578);
    }
    if ((local_552 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 10;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_550);
    if (local_178 != 0) goto LAB_0015865f;
  }
  else {
LAB_0015865f:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15867b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x1586de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x158736);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_5d0,"precision not allowed for this argument type",&local_5d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
    local_5d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_5fc = 0x2a;
      fmt::v5::format<char[7],unsigned_int>
                ((char (*) [7])in_stack_ffffffffffffec18,(uint *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_5f8);
    }
    if ((local_5d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0xb;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_5d0);
    if (local_178 != 0) goto LAB_00158adc;
  }
  else {
LAB_00158adc:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x158af8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x158b5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x158bb3);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_630);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_650,"precision not allowed for this argument type",&local_651);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
    local_652 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_67c = 0x2a;
      fmt::v5::format<char[8],unsigned_int>
                ((char (*) [8])in_stack_ffffffffffffec18,(uint *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_678);
    }
    if ((local_652 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [104])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0xc;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_650);
    if (local_178 != 0) goto LAB_00158f59;
  }
  else {
LAB_00158f59:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x158f75);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x158fd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x159030);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_6d0,"precision not allowed for this argument type",&local_6d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
    local_6d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_700 = 0x2a;
      fmt::v5::format<char[7],long>
                ((char (*) [7])in_stack_ffffffffffffec18,(long *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_6f8);
    }
    if ((local_6d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [103])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0xd;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_6d0);
    if (local_178 != 0) goto LAB_001593d7;
  }
  else {
LAB_001593d7:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x1593f3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x159456);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1594ae);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_730);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_750,"precision not allowed for this argument type",&local_751);
    std::allocator<char>::~allocator((allocator<char> *)&local_751);
    local_752 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_780 = 0x2a;
      fmt::v5::format<char[8],long>
                ((char (*) [8])in_stack_ffffffffffffec18,(long *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_778);
    }
    if ((local_752 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [104])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0xe;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_750);
    if (local_178 != 0) goto LAB_00159855;
  }
  else {
LAB_00159855:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x159871);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x1598d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15992c);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_7d0,"precision not allowed for this argument type",&local_7d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
    local_7d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_800 = 0x2a;
      fmt::v5::format<char[7],unsigned_long>
                ((char (*) [7])in_stack_ffffffffffffec18,(unsigned_long *)in_stack_ffffffffffffec10)
      ;
      std::__cxx11::string::~string(local_7f8);
    }
    if ((local_7d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [104])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0xf;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_7d0);
    if (local_178 != 0) goto LAB_00159cd3;
  }
  else {
LAB_00159cd3:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x159cef);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x159d52);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x159daa);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_830);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_850,"precision not allowed for this argument type",&local_851);
    std::allocator<char>::~allocator((allocator<char> *)&local_851);
    local_852 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_880 = 0x2a;
      fmt::v5::format<char[8],unsigned_long>
                ((char (*) [8])in_stack_ffffffffffffec18,(unsigned_long *)in_stack_ffffffffffffec10)
      ;
      std::__cxx11::string::~string(local_878);
    }
    if ((local_852 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [105])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0x10;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_850);
    if (local_178 != 0) goto LAB_0015a151;
  }
  else {
LAB_0015a151:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15a16d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15a1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15a228);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_8d0,"precision not allowed for this argument type",&local_8d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
    local_8d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_900 = 0x2a;
      fmt::v5::format<char[7],long_long>
                ((char (*) [7])in_stack_ffffffffffffec18,(longlong *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_8f8);
    }
    if ((local_8d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [104])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0x11;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_8d0);
    if (local_178 != 0) goto LAB_0015a5cf;
  }
  else {
LAB_0015a5cf:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15a5eb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15a64e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15a6a6);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_930);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_950,"precision not allowed for this argument type",&local_951);
    std::allocator<char>::~allocator((allocator<char> *)&local_951);
    local_952 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_980 = 0x2a;
      fmt::v5::format<char[8],long_long>
                ((char (*) [8])in_stack_ffffffffffffec18,(longlong *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_978);
    }
    if ((local_952 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [105])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0x12;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_950);
    if (local_178 != 0) goto LAB_0015aa4d;
  }
  else {
LAB_0015aa4d:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15aa69);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15aacc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15ab24);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_9d0,"precision not allowed for this argument type",&local_9d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
    local_9d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_a00 = 0x2a;
      fmt::v5::format<char[7],unsigned_long_long>
                ((char (*) [7])in_stack_ffffffffffffec18,
                 (unsigned_long_long *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_9f8);
    }
    if ((local_9d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [105])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0x13;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_9d0);
    if (local_178 != 0) goto LAB_0015aecb;
  }
  else {
LAB_0015aecb:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15aee7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15af4a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15afa2);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a50,"precision not allowed for this argument type",&local_a51);
    std::allocator<char>::~allocator((allocator<char> *)&local_a51);
    local_a52 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_a80 = 0x2a;
      fmt::v5::format<char[8],unsigned_long_long>
                ((char (*) [8])in_stack_ffffffffffffec18,
                 (unsigned_long_long *)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_a78);
    }
    if ((local_a52 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [106])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0x14;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_a50);
    if (local_178 != 0) goto LAB_0015b349;
  }
  else {
LAB_0015b349:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15b365);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15b3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15b420);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ab0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_ad0,"precision not allowed for this argument type",&local_ad1);
    std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
    local_ad2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_af9 = 0x78;
      fmt::v5::format<char[8],char>
                ((char (*) [8])in_stack_ffffffffffffec18,&in_stack_ffffffffffffec10->success_);
      std::__cxx11::string::~string(local_af8);
    }
    if ((local_ad2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [104])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0x15;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_ad0);
    if (local_178 != 0) goto LAB_0015b7c3;
  }
  else {
LAB_0015b7c3:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15b7df);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15b842);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15b89a);
  local_b58 = 0x3ff3c083126e978d;
  fmt::v5::format<char[7],double>
            ((char (*) [7])in_stack_ffffffffffffec18,(double *)in_stack_ffffffffffffec10);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8),
             in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
  std::__cxx11::string::~string(local_b50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15b99e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15ba01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15ba59);
  local_ba8 = _DAT_003380a0;
  fmt::v5::format<char[7],long_double>
            ((char (*) [7])in_stack_ffffffffffffec18,(longdouble *)in_stack_ffffffffffffec10);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8),
             in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
  std::__cxx11::string::~string(local_b98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15bb58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15bbbb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15bc13);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_bc8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_be8,"precision not allowed for this argument type",&local_be9);
    std::allocator<char>::~allocator((allocator<char> *)&local_be9);
    local_bea = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_c18 = 0xcafe;
      fmt::v5::format<char[7],void*>
                ((char (*) [7])in_stack_ffffffffffffec18,(void **)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_c10);
    }
    if ((local_bea & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [131])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0x16;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_be8);
    if (local_178 != 0) goto LAB_0015bfae;
  }
  else {
LAB_0015bfae:
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15bfca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15c027);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15c07f);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c48);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c68,"precision not allowed for this argument type",&local_c69);
    std::allocator<char>::~allocator((allocator<char> *)&local_c69);
    local_c6a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_c98 = 0xcafe;
      fmt::v5::format<char[8],void*>
                ((char (*) [8])in_stack_ffffffffffffec18,(void **)in_stack_ffffffffffffec10);
      std::__cxx11::string::~string(local_c90);
    }
    if ((local_c6a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_ffffffffffffec10,
                 (char (*) [132])CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
      local_178 = 0x17;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_c68);
    if (local_178 == 0) goto LAB_0015c4ae;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffec10);
  in_stack_ffffffffffffebf0 = testing::AssertionResult::failure_message((AssertionResult *)0x15c406)
  ;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
             in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
  testing::Message::~Message((Message *)0x15c463);
LAB_0015c4ae:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15c4bb);
  expected = local_ce8;
  fmt::v5::format<char[7],char[4]>
            ((char (*) [7])in_stack_ffffffffffffec18,&in_stack_ffffffffffffec10->success_);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf8),
             in_stack_ffffffffffffebf0,(char (*) [3])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffebe7,in_stack_ffffffffffffebe0));
  std::__cxx11::string::~string(local_ce8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_cc8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffec10);
    testing::AssertionResult::failure_message((AssertionResult *)0x15c5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c,
               in_stack_ffffffffffffec00,in_stack_ffffffffffffebfc,in_stack_ffffffffffffebf0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffebe0));
    testing::Message::~Message((Message *)0x15c5fb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15c650);
  return;
}

Assistant:

TEST(FormatterTest, Precision) {
  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{0:.%u", UINT_MAX);
  increment(format_str + 4);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  std::size_t size = std::strlen(format_str);
  format_str[size] = '}';
  format_str[size + 1] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  safe_sprintf(format_str, "{0:.%u", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  safe_sprintf(format_str, "{0:.%u}", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  EXPECT_THROW_MSG(format("{0:.", 0),
      format_error, "missing precision specifier");
  EXPECT_THROW_MSG(format("{0:.}", 0),
      format_error, "missing precision specifier");

  EXPECT_THROW_MSG(format("{0:.2", 0),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42u),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42u),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42l),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42l),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42ul),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42ul),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42ll),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42ll),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42ull),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42ull),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:3.0}", 'x'),
      format_error, "precision not allowed for this argument type");
  EXPECT_EQ("1.2", format("{0:.2}", 1.2345));
  EXPECT_EQ("1.2", format("{0:.2}", 1.2345l));

  EXPECT_THROW_MSG(format("{0:.2}", reinterpret_cast<void*>(0xcafe)),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", reinterpret_cast<void*>(0xcafe)),
      format_error, "precision not allowed for this argument type");

  EXPECT_EQ("st", format("{0:.2}", "str"));
}